

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

void ctype_repr(CTRepr *ctr,CTypeID id)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char *t;
  uint32_t local_bc;
  CTSize csize;
  CTSize size;
  CTInfo info;
  int ptrto;
  CTInfo qual;
  CType *ct;
  CTypeID id_local;
  CTRepr *ctr_local;
  
  _ptrto = ctr->cts->tab + id;
  info = 0;
  bVar3 = false;
  do {
    uVar1 = _ptrto->info;
    local_bc = _ptrto->size;
    switch(uVar1 >> 0x1c) {
    case 0:
      if ((uVar1 & 0x8000000) == 0) {
        if ((uVar1 & 0x4000000) == 0) {
          if (local_bc == 1) {
            if ((uVar1 & 0x800000) == 0) {
              ctype_prepstr(ctr,"char",4);
            }
            else {
              ctype_prepstr(ctr,"unsigned char",0xd);
            }
          }
          else if (local_bc < 8) {
            if (local_bc == 4) {
              ctype_prepstr(ctr,"int",3);
            }
            else {
              ctype_prepstr(ctr,"short",5);
            }
            if ((uVar1 & 0x800000) != 0) {
              ctype_prepstr(ctr,"unsigned",8);
            }
          }
          else {
            ctype_prepstr(ctr,"_t",2);
            ctype_prepnum(ctr,local_bc << 3);
            ctype_prepstr(ctr,"int",3);
            if ((uVar1 & 0x800000) != 0) {
              ctype_prepc(ctr,0x75);
            }
          }
        }
        else if (local_bc == 8) {
          ctype_prepstr(ctr,"double",6);
        }
        else if (local_bc == 4) {
          ctype_prepstr(ctr,"float",5);
        }
        else {
          ctype_prepstr(ctr,"long double",0xb);
        }
      }
      else {
        ctype_prepstr(ctr,"bool",4);
      }
      ctype_prepqual(ctr,info | uVar1);
      return;
    case 1:
      t = "struct";
      if ((uVar1 & 0x800000) != 0) {
        t = "union";
      }
      ctype_preptype(ctr,_ptrto,info,t);
      return;
    case 2:
      if ((uVar1 & 0x800000) == 0) {
        ctype_prepqual(ctr,info | uVar1);
        if (local_bc == 4) {
          ctype_prepstr(ctr,"__ptr32",7);
        }
        ctype_prepc(ctr,0x2a);
      }
      else {
        ctype_prepc(ctr,0x26);
      }
      info = 0;
      bVar3 = true;
      ctr->needsp = 1;
      break;
    case 3:
      if ((uVar1 & 0xfc000000) == 0x30000000) {
        ctr->needsp = 1;
        if (bVar3) {
          bVar3 = false;
          ctype_prepc(ctr,0x28);
          ctype_appc(ctr,0x29);
        }
        ctype_appc(ctr,0x5b);
        if (local_bc == 0xffffffff) {
          if ((uVar1 & 0x100000) != 0) {
            ctype_appc(ctr,0x3f);
          }
        }
        else {
          uVar2 = ctr->cts->tab[_ptrto->info & 0xffff].size;
          if (uVar2 == 0) {
            local_bc = 0;
          }
          else {
            local_bc = local_bc / uVar2;
          }
          ctype_appnum(ctr,local_bc);
        }
        ctype_appc(ctr,0x5d);
      }
      else {
        if ((uVar1 & 0x4000000) != 0) {
          if (local_bc == 8) {
            ctype_prepstr(ctr,"float",5);
          }
          ctype_prepstr(ctr,"complex",7);
          return;
        }
        ctype_prepstr(ctr,")))",3);
        ctype_prepnum(ctr,local_bc);
        ctype_prepstr(ctr,"__attribute__((vector_size(",0x1b);
      }
      break;
    case 4:
      ctype_prepstr(ctr,"void",4);
      ctype_prepqual(ctr,info | uVar1);
      return;
    case 5:
      if (id == 0x16) {
        ctype_prepstr(ctr,"ctype",5);
        return;
      }
      ctype_preptype(ctr,_ptrto,info,"enum");
      return;
    case 6:
      ctr->needsp = 1;
      if (bVar3) {
        bVar3 = false;
        ctype_prepc(ctr,0x28);
        ctype_appc(ctr,0x29);
      }
      ctype_appc(ctr,0x28);
      ctype_appc(ctr,0x29);
      break;
    default:
      break;
    case 8:
      if ((uVar1 >> 0x10 & 0xff) == 1) {
        info = local_bc | info;
      }
    }
    _ptrto = ctr->cts->tab + (uVar1 & 0xffff);
  } while( true );
}

Assistant:

static void ctype_repr(CTRepr *ctr, CTypeID id)
{
  CType *ct = ctype_get(ctr->cts, id);
  CTInfo qual = 0;
  int ptrto = 0;
  for (;;) {
    CTInfo info = ct->info;
    CTSize size = ct->size;
    switch (ctype_type(info)) {
    case CT_NUM:
      if ((info & CTF_BOOL)) {
	ctype_preplit(ctr, "bool");
      } else if ((info & CTF_FP)) {
	if (size == sizeof(double)) ctype_preplit(ctr, "double");
	else if (size == sizeof(float)) ctype_preplit(ctr, "float");
	else ctype_preplit(ctr, "long double");
      } else if (size == 1) {
	if (!((info ^ CTF_UCHAR) & CTF_UNSIGNED)) ctype_preplit(ctr, "char");
	else if (CTF_UCHAR) ctype_preplit(ctr, "signed char");
	else ctype_preplit(ctr, "unsigned char");
      } else if (size < 8) {
	if (size == 4) ctype_preplit(ctr, "int");
	else ctype_preplit(ctr, "short");
	if ((info & CTF_UNSIGNED)) ctype_preplit(ctr, "unsigned");
      } else {
	ctype_preplit(ctr, "_t");
	ctype_prepnum(ctr, size*8);
	ctype_preplit(ctr, "int");
	if ((info & CTF_UNSIGNED)) ctype_prepc(ctr, 'u');
      }
      ctype_prepqual(ctr, (qual|info));
      return;
    case CT_VOID:
      ctype_preplit(ctr, "void");
      ctype_prepqual(ctr, (qual|info));
      return;
    case CT_STRUCT:
      ctype_preptype(ctr, ct, qual, (info & CTF_UNION) ? "union" : "struct");
      return;
    case CT_ENUM:
      if (id == CTID_CTYPEID) {
	ctype_preplit(ctr, "ctype");
	return;
      }
      ctype_preptype(ctr, ct, qual, "enum");
      return;
    case CT_ATTRIB:
      if (ctype_attrib(info) == CTA_QUAL) qual |= size;
      break;
    case CT_PTR:
      if ((info & CTF_REF)) {
	ctype_prepc(ctr, '&');
      } else {
	ctype_prepqual(ctr, (qual|info));
	if (LJ_64 && size == 4) ctype_preplit(ctr, "__ptr32");
	ctype_prepc(ctr, '*');
      }
      qual = 0;
      ptrto = 1;
      ctr->needsp = 1;
      break;
    case CT_ARRAY:
      if (ctype_isrefarray(info)) {
	ctr->needsp = 1;
	if (ptrto) { ptrto = 0; ctype_prepc(ctr, '('); ctype_appc(ctr, ')'); }
	ctype_appc(ctr, '[');
	if (size != CTSIZE_INVALID) {
	  CTSize csize = ctype_child(ctr->cts, ct)->size;
	  ctype_appnum(ctr, csize ? size/csize : 0);
	} else if ((info & CTF_VLA)) {
	  ctype_appc(ctr, '?');
	}
	ctype_appc(ctr, ']');
      } else if ((info & CTF_COMPLEX)) {
	if (size == 2*sizeof(float)) ctype_preplit(ctr, "float");
	ctype_preplit(ctr, "complex");
	return;
      } else {
	ctype_preplit(ctr, ")))");
	ctype_prepnum(ctr, size);
	ctype_preplit(ctr, "__attribute__((vector_size(");
      }
      break;
    case CT_FUNC:
      ctr->needsp = 1;
      if (ptrto) { ptrto = 0; ctype_prepc(ctr, '('); ctype_appc(ctr, ')'); }
      ctype_appc(ctr, '(');
      ctype_appc(ctr, ')');
      break;
    default:
      lj_assertG_(ctr->cts->g, 0, "bad ctype %08x", info);
      break;
    }
    ct = ctype_get(ctr->cts, ctype_cid(info));
  }
}